

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
 __thiscall
duckdb::BindDecimalArithmetic<false>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  vector<duckdb::LogicalType,_true> *this_00;
  uint8_t uVar1;
  bool bVar2;
  byte bVar3;
  uint8_t uVar4;
  reference pvVar5;
  pointer pEVar6;
  pointer pDVar7;
  reference this_01;
  InternalException *this_02;
  byte bVar8;
  LogicalType *this_03;
  idx_t i;
  ulong uVar9;
  byte scale_00;
  byte bVar10;
  uint8_t scale;
  uint8_t width;
  allocator local_89;
  _Head_base<0UL,_duckdb::DecimalArithmeticBindData_*,_false> local_88;
  ulong local_80;
  ScalarFunction *local_78;
  LogicalType result_type;
  string local_50;
  
  local_88._M_head_impl = (DecimalArithmeticBindData *)this;
  local_78 = bound_function;
  make_uniq<duckdb::DecimalArithmeticBindData>();
  scale_00 = 0;
  bVar3 = 0;
  bVar10 = 0;
  uVar9 = 0;
  local_80 = 0;
  while( true ) {
    bVar8 = (byte)local_80;
    if ((ulong)((long)(arguments->
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(arguments->
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar9) break;
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,uVar9);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    if ((pEVar6->return_type).id_ != UNKNOWN) {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,uVar9);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      bVar2 = LogicalType::GetDecimalProperties(&pEVar6->return_type,&width,&scale);
      if (!bVar2) {
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&result_type,"Could not convert type %s to a decimal.",&local_89);
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(arguments,uVar9);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar5);
        LogicalType::ToString_abi_cxx11_(&local_50,&pEVar6->return_type);
        InternalException::InternalException<std::__cxx11::string>
                  (this_02,(string *)&result_type,&local_50);
        __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((byte)local_80 < width) {
        bVar8 = width;
      }
      bVar3 = scale_00;
      if (scale_00 < scale) {
        bVar3 = scale;
      }
      if (bVar10 < (byte)(width - scale)) {
        bVar10 = width - scale;
      }
      local_80 = (ulong)bVar8;
      scale_00 = bVar3;
    }
    uVar9 = uVar9 + 1;
  }
  if ((byte)local_80 < (byte)(bVar10 + bVar3)) {
    bVar8 = bVar10 + bVar3;
  }
  bVar3 = NumericCastImpl<unsigned_char,_int,_false>::Convert(bVar8 + 1);
  if ((bVar3 < 0x13) || (0x12 < (byte)local_80)) {
    if (bVar3 < 0x27) goto LAB_007b1afa;
    pDVar7 = unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
             ::operator->((unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
                           *)local_88._M_head_impl);
    bVar3 = 0x26;
  }
  else {
    pDVar7 = unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
             ::operator->((unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
                           *)local_88._M_head_impl);
    bVar3 = 0x12;
  }
  pDVar7->check_overflow = true;
LAB_007b1afa:
  LogicalType::DECIMAL(&result_type,bVar3,scale_00);
  this_00 = &(local_78->super_BaseScalarFunction).super_SimpleFunction.arguments;
  for (uVar9 = 0;
      uVar9 < (ulong)((long)(arguments->
                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ).
                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(arguments->
                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ).
                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1) {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,uVar9);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    this_03 = &pEVar6->return_type;
    LogicalType::GetDecimalProperties(this_03,&width,&scale);
    uVar1 = scale;
    uVar4 = DecimalType::GetScale(&result_type);
    if ((uVar1 == uVar4) && ((pEVar6->return_type).physical_type_ == result_type.physical_type_)) {
      this_01 = vector<duckdb::LogicalType,_true>::get<true>(this_00,uVar9);
    }
    else {
      this_01 = vector<duckdb::LogicalType,_true>::get<true>(this_00,uVar9);
      this_03 = &result_type;
    }
    LogicalType::operator=(this_01,this_03);
  }
  LogicalType::operator=(&(local_78->super_BaseScalarFunction).return_type,&result_type);
  LogicalType::~LogicalType(&result_type);
  return (unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>_>
          )(_Tuple_impl<0UL,_duckdb::DecimalArithmeticBindData_*,_std::default_delete<duckdb::DecimalArithmeticBindData>_>
            )local_88._M_head_impl;
}

Assistant:

unique_ptr<DecimalArithmeticBindData> BindDecimalArithmetic(ClientContext &context, ScalarFunction &bound_function,
                                                            vector<unique_ptr<Expression>> &arguments) {
	auto bind_data = make_uniq<DecimalArithmeticBindData>();

	// get the max width and scale of the input arguments
	uint8_t max_width = 0, max_scale = 0, max_width_over_scale = 0;
	for (idx_t i = 0; i < arguments.size(); i++) {
		if (arguments[i]->return_type.id() == LogicalTypeId::UNKNOWN) {
			continue;
		}
		uint8_t width, scale;
		auto can_convert = arguments[i]->return_type.GetDecimalProperties(width, scale);
		if (!can_convert) {
			throw InternalException("Could not convert type %s to a decimal.", arguments[i]->return_type.ToString());
		}
		max_width = MaxValue<uint8_t>(width, max_width);
		max_scale = MaxValue<uint8_t>(scale, max_scale);
		max_width_over_scale = MaxValue<uint8_t>(width - scale, max_width_over_scale);
	}
	D_ASSERT(max_width > 0);
	uint8_t required_width = MaxValue<uint8_t>(max_scale + max_width_over_scale, max_width);
	if (!IS_MODULO) {
		// for addition/subtraction, we add 1 to the width to ensure we don't overflow
		required_width = NumericCast<uint8_t>(required_width + 1);
		if (required_width > Decimal::MAX_WIDTH_INT64 && max_width <= Decimal::MAX_WIDTH_INT64) {
			// we don't automatically promote past the hugeint boundary to avoid the large hugeint performance penalty
			bind_data->check_overflow = true;
			required_width = Decimal::MAX_WIDTH_INT64;
		}
	}
	if (required_width > Decimal::MAX_WIDTH_DECIMAL) {
		// target width does not fit in decimal at all: truncate the scale and perform overflow detection
		bind_data->check_overflow = true;
		required_width = Decimal::MAX_WIDTH_DECIMAL;
	}
	// arithmetic between two decimal arguments: check the types of the input arguments
	LogicalType result_type = LogicalType::DECIMAL(required_width, max_scale);
	// we cast all input types to the specified type
	for (idx_t i = 0; i < arguments.size(); i++) {
		// first check if the cast is necessary
		// if the argument has a matching scale and internal type as the output type, no casting is necessary
		auto &argument_type = arguments[i]->return_type;
		uint8_t width, scale;
		argument_type.GetDecimalProperties(width, scale);
		if (scale == DecimalType::GetScale(result_type) && argument_type.InternalType() == result_type.InternalType()) {
			bound_function.arguments[i] = argument_type;
		} else {
			bound_function.arguments[i] = result_type;
		}
	}
	bound_function.return_type = result_type;
	return bind_data;
}